

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_obj.c
# Opt level: O3

mesh * import_obj_model(scene *scene,char *file_name)

{
  obj_index *key;
  attr_buf *paVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  vec3 *pvVar5;
  long lVar6;
  bool bVar7;
  obj_model *model;
  size_t sVar8;
  hash_table *hash_table;
  mesh *mesh;
  size_t sVar9;
  size_t sVar10;
  size_t *psVar11;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint hash;
  long lVar16;
  size_t sVar17;
  obj_face *poVar18;
  uint uVar19;
  size_t sVar20;
  size_t index_count;
  size_t local_38;
  
  model = load_obj_model(file_name);
  if (model == (obj_model *)0x0) {
    mesh = (mesh *)0x0;
  }
  else {
    sVar8 = model->face_count;
    if (sVar8 == 0) {
      sVar20 = 0;
    }
    else {
      psVar11 = &model->faces->index_count;
      sVar20 = 0;
      do {
        lVar15 = *psVar11 - 2;
        if (*psVar11 < 3) {
          lVar15 = 1;
        }
        sVar20 = sVar20 + lVar15;
        psVar11 = psVar11 + 2;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
    }
    hash_table = new_hash_table(0x18,8);
    sVar8 = model->index_count;
    if (sVar8 == 0) {
      sVar8 = 4;
      uVar19 = 0;
      bVar7 = false;
    }
    else {
      lVar15 = 0;
      bVar7 = false;
      uVar19 = 0;
      sVar17 = 0;
      do {
        key = model->indices + sVar17;
        local_38 = hash_table->size;
        hash = 0x811c9dc5;
        lVar16 = 0;
        do {
          hash = (*(byte *)((long)&model->indices->v + lVar16 + lVar15) ^ hash) * 0x1000193;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x18);
        bVar7 = (bool)(bVar7 | key->n != 0);
        uVar19 = (uint)(byte)((byte)uVar19 | key->t != 0);
        insert_in_hash_table(hash_table,key,0x18,&local_38,8,hash,compare_obj_index);
        sVar17 = sVar17 + 1;
        lVar15 = lVar15 + 0x18;
      } while (sVar17 != sVar8);
      sVar8 = (ulong)uVar19 | 4;
    }
    pvVar12 = (void *)0x0;
    mesh = new_mesh(TRI_MESH,sVar20,hash_table->size,obj_attr_types,obj_attr_bindings,sVar8);
    paVar1 = mesh->attrs;
    if (uVar19 != 0) {
      pvVar12 = paVar1[mesh->attr_count - 1].data;
    }
    sVar8 = hash_table->cap;
    if (sVar8 != 0) {
      pvVar2 = paVar1->data;
      pvVar3 = paVar1[1].data;
      lVar15 = 4;
      sVar20 = 0;
      do {
        if ((int)hash_table->hashes[sVar20] < 0) {
          pvVar4 = hash_table->keys;
          lVar16 = *(long *)((long)hash_table->values + sVar20 * 8);
          pvVar5 = model->vertices;
          lVar6 = *(long *)((long)pvVar4 + lVar15 * 4 + -0x10);
          *(real_t *)((long)pvVar2 + lVar16 * 0xc + 8) = pvVar5[lVar6]._[2];
          *(undefined8 *)((long)pvVar2 + lVar16 * 0xc) = *(undefined8 *)pvVar5[lVar6]._;
          if (bVar7) {
            pvVar5 = model->normals;
            lVar6 = *(long *)((long)pvVar4 + lVar15 * 4 + -8);
            *(real_t *)((long)pvVar3 + lVar16 * 0xc + 8) = pvVar5[lVar6]._[2];
            *(undefined8 *)((long)pvVar3 + lVar16 * 0xc) = *(undefined8 *)pvVar5[lVar6]._;
          }
          if (uVar19 != 0) {
            *(undefined8 *)((long)pvVar12 + lVar16 * 8) =
                 *(undefined8 *)model->tex_coords[*(long *)((long)pvVar4 + lVar15 * 4)]._;
          }
        }
        sVar20 = sVar20 + 1;
        lVar15 = lVar15 + 6;
      } while (sVar8 != sVar20);
    }
    sVar8 = model->face_count;
    if (sVar8 != 0) {
      sVar20 = 0;
      uVar13 = 0;
      do {
        if (model->faces[sVar20].index_count < 3) {
          __assert_fail("face->index_count >= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/import_obj.c"
                        ,0x65,"struct mesh *build_mesh_from_obj_model(const struct obj_model *)");
        }
        poVar18 = model->faces + sVar20;
        sVar9 = translate_obj_index(hash_table,model->indices + poVar18->first_index);
        sVar17 = translate_obj_index(hash_table,model->indices + poVar18->first_index + 1);
        uVar14 = uVar13;
        if (2 < poVar18->index_count) {
          lVar16 = poVar18->index_count - 2;
          lVar15 = 0x30;
          do {
            if (mesh->primitive_count <= uVar14) {
              __assert_fail("k < mesh->primitive_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/import_obj.c"
                            ,0x78,"struct mesh *build_mesh_from_obj_model(const struct obj_model *)"
                           );
            }
            sVar10 = translate_obj_index(hash_table,
                                         (obj_index *)
                                         ((long)&model->indices[poVar18->first_index].v + lVar15));
            psVar11 = mesh->indices;
            *(size_t *)((long)psVar11 + lVar15 + -0x30 + uVar13 * 0x18) = sVar9;
            *(size_t *)((long)psVar11 + lVar15 + -0x28 + uVar13 * 0x18) = sVar17;
            *(size_t *)((long)psVar11 + lVar15 + -0x20 + uVar13 * 0x18) = sVar10;
            uVar14 = uVar14 + 1;
            lVar15 = lVar15 + 0x18;
            lVar16 = lVar16 + -1;
            sVar17 = sVar10;
          } while (lVar16 != 0);
        }
        sVar20 = sVar20 + 1;
        uVar13 = uVar14;
      } while (sVar20 != sVar8);
    }
    free_hash_table(hash_table);
    recompute_geometry_normals(mesh);
    if (!bVar7) {
      recompute_shading_normals(mesh);
    }
    free_obj_model(model);
  }
  return mesh;
}

Assistant:

struct mesh* import_obj_model(struct scene* scene, const char* file_name) {
    // TODO: Convert materials
    IGNORE(scene);
    struct obj_model* model = load_obj_model(file_name);
    if (!model)
        return NULL;
    struct mesh* mesh = build_mesh_from_obj_model(model);
    free_obj_model(model);
    return mesh;
}